

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coins_tests.cpp
# Opt level: O1

void __thiscall
coins_tests::CacheTest::SimulationTest(CacheTest *this,CCoinsView *base,bool fake_best_block)

{
  COutPoint *outpoint;
  size_t *psVar1;
  uchar *puVar2;
  Coin *pCVar3;
  pointer puVar4;
  pointer puVar5;
  class_property<bool> cVar6;
  readonly_property<bool> rVar7;
  byte bVar8;
  bool bVar9;
  readonly_property<bool> rVar10;
  readonly_property<bool> rVar11;
  readonly_property<bool> rVar12;
  readonly_property<bool> rVar13;
  uint uVar14;
  CCoinsViewCache *pCVar15;
  uint64_t uVar16;
  mapped_type *a;
  uint64_t uVar17;
  uint64_t uVar18;
  Coin *pCVar19;
  Coin *pCVar20;
  CCoinsViewCache *pCVar21;
  _Rb_tree_node_base *p_Var22;
  CCoinsViewCache *pCVar23;
  tuple<(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  this_00;
  readonly_property<bool> rVar24;
  unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
  *test;
  _Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> outpoint_00;
  CCoinsView *baseIn;
  readonly_property<bool> rVar25;
  pointer *__ptr;
  ulong uVar26;
  iterator in_R8;
  iterator pvVar27;
  iterator in_R9;
  iterator pvVar28;
  ulong uVar29;
  ulong uVar30;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *ppVar31;
  long lVar32;
  FastRandomContext *this_01;
  long in_FS_OFFSET;
  Span<std::byte> output;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string file_04;
  const_string file_05;
  const_string file_06;
  Span<std::byte> output_00;
  const_string file_07;
  Span<std::byte> output_01;
  const_string file_08;
  const_string file_09;
  const_string file_10;
  const_string file_11;
  const_string file_12;
  const_string file_13;
  const_string file_14;
  const_string file_15;
  const_string file_16;
  const_string file_17;
  const_string file_18;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  const_string msg_04;
  const_string msg_05;
  const_string msg_06;
  const_string msg_07;
  const_string msg_08;
  const_string msg_09;
  const_string msg_10;
  const_string msg_11;
  const_string msg_12;
  const_string msg_13;
  const_string msg_14;
  const_string msg_15;
  const_string msg_16;
  const_string msg_17;
  const_string msg_18;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> txids;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  stack;
  uint256 ret;
  value_type txid;
  map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  result;
  check_type cVar33;
  uint uVar34;
  undefined1 uVar35;
  uint uVar36;
  int local_564;
  undefined1 uVar37;
  undefined8 uVar38;
  char *local_510;
  char *local_508;
  undefined1 *local_500;
  undefined1 *local_4f8;
  char *local_4f0;
  char *local_4e8;
  char *local_4e0;
  char *local_4d8;
  undefined1 *local_4d0;
  undefined1 *local_4c8;
  char *local_4c0;
  char *local_4b8;
  char *local_4b0;
  char *local_4a8;
  undefined1 *local_4a0;
  undefined1 *local_498;
  char *local_490;
  char *local_488;
  char *local_480;
  char *local_478;
  undefined1 *local_470;
  undefined1 *local_468;
  char *local_460;
  char *local_458;
  char *local_450;
  char *local_448;
  undefined1 *local_440;
  undefined1 *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  char *local_418;
  undefined1 *local_410;
  undefined1 *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  char *local_3e8;
  undefined1 *local_3e0;
  undefined1 *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  char *local_3b8;
  undefined1 *local_3b0;
  undefined1 *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  char *local_388;
  undefined1 *local_380;
  undefined1 *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  char *local_358;
  undefined1 *local_350;
  undefined1 *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  char *local_328;
  undefined1 *local_320;
  undefined1 *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  char *local_2f8;
  undefined1 *local_2f0;
  undefined1 *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  char *local_2c8;
  undefined1 *local_2c0;
  undefined1 *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  char *local_268;
  undefined1 *local_260;
  undefined1 *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  undefined1 *local_230;
  undefined1 *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  char *local_208;
  _List_node_base local_200;
  assertion_result local_1f0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_> local_128;
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  local_108;
  undefined1 local_e8 [8];
  element_type *peStack_e0;
  shared_count sStack_d8;
  _List_node_base *p_Stack_d0;
  uint32_t local_c8;
  undefined1 local_b8 [8];
  undefined1 auStack_b0 [28];
  uint local_94;
  uint local_90;
  undefined1 local_88 [16];
  sp_counted_base *local_78;
  _List_node_base *p_Stack_70;
  _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
  local_68;
  ListNode *local_38;
  
  local_38 = *(ListNode **)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_108.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_108.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_108.
  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  pCVar15 = (CCoinsViewCache *)operator_new(0x1c8);
  CCoinsViewCache::CCoinsViewCache(pCVar15,base,false);
  (pCVar15->super_CCoinsViewBacked).super_CCoinsView._vptr_CCoinsView =
       (_func_int **)&PTR_GetCoin_013ad110;
  local_b8 = (undefined1  [8])pCVar15;
  std::
  vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
  ::push_back(&local_108,(value_type *)local_b8);
  if (local_b8 != (undefined1  [8])0x0) {
    (**(code **)(*(long *)(((uint256 *)&((CCoinsViewCache *)local_b8)->super_CCoinsViewBacked)->
                          super_base_blob<256U>).m_data._M_elems + 0x38))();
  }
  local_128.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_128.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_128.
  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>::
  resize(&local_128,5000);
  if (local_128.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_128.
      super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    uVar30 = 1;
    uVar29 = 0;
    do {
      uVar26 = uVar30;
      auStack_b0._8_8_ = (undefined1 *)0x0;
      auStack_b0._16_8_ =
           (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)0x0;
      local_b8 = (undefined1  [8])0x0;
      auStack_b0._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      output.m_size = 0x20;
      output.m_data = local_b8;
      FastRandomContext::fillrand(&(this->super_BasicTestingSetup).m_rng,output);
      puVar2 = local_128.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 0x10;
      *(undefined8 *)puVar2 = auStack_b0._8_8_;
      *(undefined8 *)(puVar2 + 8) = auStack_b0._16_8_;
      *(undefined1 (*) [8])
       local_128.
       super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
       ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.m_data.
       _M_elems = local_b8;
      *(undefined8 *)
       (local_128.
        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
        ._M_impl.super__Vector_impl_data._M_start[uVar29].m_wrapped.super_base_blob<256U>.m_data.
        _M_elems + 8) = auStack_b0._0_8_;
      uVar30 = (ulong)((int)uVar26 + 1);
      uVar29 = uVar26;
    } while (uVar26 < (ulong)((long)local_128.
                                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_128.
                                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  this_01 = &(this->super_BasicTestingSetup).m_rng;
  rVar25.super_class_property<bool>.value = (class_property<bool>)false;
  cVar33 = CHECK_PRED;
  uVar36 = 0;
  rVar11.super_class_property<bool>.value = (class_property<bool>)false;
  rVar10.super_class_property<bool>.value = (class_property<bool>)false;
  uVar34 = 0;
  rVar12.super_class_property<bool>.value = (class_property<bool>)false;
  rVar13.super_class_property<bool>.value = (class_property<bool>)false;
  rVar24.super_class_property<bool>.value = (class_property<bool>)false;
  uVar38 = 0;
  local_564 = 0;
  do {
    uVar30 = ((long)local_128.
                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_128.
                    super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5) - 1;
    if (uVar30 == 0) {
      uVar14 = 0x40;
    }
    else {
      lVar32 = 0x3f;
      if (uVar30 != 0) {
        for (; uVar30 >> lVar32 == 0; lVar32 = lVar32 + -1) {
        }
      }
      uVar14 = (uint)lVar32 ^ 0x3f;
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_01->super_RandomMixin<FastRandomContext>,0x40 - uVar14);
    } while (uVar30 < uVar16);
    local_b8 = *(undefined1 (*) [8])
                local_128.
                super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                ._M_impl.super__Vector_impl_data._M_start[uVar16].m_wrapped.super_base_blob<256U>.
                m_data._M_elems;
    auStack_b0._0_8_ =
         *(undefined8 *)
          (local_128.
           super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
           ._M_impl.super__Vector_impl_data._M_start[uVar16].m_wrapped.super_base_blob<256U>.m_data.
           _M_elems + 8);
    puVar2 = local_128.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar16].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 0x10;
    auStack_b0._8_8_ = *(undefined8 *)puVar2;
    auStack_b0._16_8_ = *(undefined8 *)(puVar2 + 8);
    auStack_b0._24_4_ = 0;
    local_88._0_8_ = local_b8;
    local_88._8_8_ = auStack_b0._0_8_;
    local_78 = (sp_counted_base *)auStack_b0._8_8_;
    p_Stack_70 = (_List_node_base *)auStack_b0._16_8_;
    a = std::
        map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
        ::operator[]((map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
                      *)&local_68,(key_type *)local_b8);
    uVar16 = RandomMixin<FastRandomContext>::randbits
                       (&this_01->super_RandomMixin<FastRandomContext>,2);
    uVar17 = RandomMixin<FastRandomContext>::randbits
                       (&this_01->super_RandomMixin<FastRandomContext>,2);
    if (uVar16 == 0) {
      local_b8 = (undefined1  [8])local_88._0_8_;
      auStack_b0._0_8_ = local_88._8_8_;
      auStack_b0._8_8_ = local_78;
      auStack_b0._16_8_ = p_Stack_70;
      auStack_b0._24_4_ = 0;
      bVar8 = (**(code **)(*(long *)((CCoinsViewCache *)
                                    ((long)local_108.
                                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                                    cachedCoinsUsage + 8))
                        ((long *)((CCoinsViewCache *)
                                 ((long)local_108.
                                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                                 cachedCoinsUsage,local_b8);
    }
    else {
      bVar8 = 0;
    }
    do {
      uVar18 = RandomMixin<FastRandomContext>::randbits
                         (&this_01->super_RandomMixin<FastRandomContext>,9);
    } while (499 < uVar18);
    if ((int)uVar18 == 0) {
      pCVar19 = AccessByTxid((CCoinsViewCache *)
                             ((CCoinsViewCache *)
                             ((long)local_108.
                                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                             cachedCoinsUsage,(Txid *)local_88);
    }
    else {
      local_b8 = (undefined1  [8])local_88._0_8_;
      auStack_b0._0_8_ = local_88._8_8_;
      auStack_b0._8_8_ = local_78;
      auStack_b0._16_8_ = p_Stack_70;
      auStack_b0._24_4_ = 0;
      pCVar19 = CCoinsViewCache::AccessCoin
                          ((CCoinsViewCache *)
                           ((CCoinsViewCache *)
                           ((long)local_108.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                           cachedCoinsUsage,(COutPoint *)local_b8);
    }
    local_138 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_130 = "";
    local_148 = &boost::unit_test::basic_cstring<char_const>::null;
    local_140 = &boost::unit_test::basic_cstring<char_const>::null;
    file.m_end = (iterator)0xae;
    file.m_begin = (iterator)&local_138;
    msg.m_end = in_R9;
    msg.m_begin = in_R8;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_148,msg);
    rVar7.super_class_property<bool>.value =
         (class_property<bool>)anon_unknown.dwarf_6976df::operator==(a,pCVar19);
    peStack_e0 = (element_type *)0x0;
    sStack_d8.pi_ = (sp_counted_base *)0x0;
    local_1f0._0_8_ = "coin == entry";
    local_1f0.m_message.px = (element_type *)0xe6ce39;
    auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
    local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
    auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
    auStack_b0._16_8_ = &local_1f0;
    local_158 = 
    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
    ;
    local_150 = "";
    in_R8 = (iterator)0x1;
    in_R9 = (iterator)0x0;
    local_e8[0] = rVar7.super_class_property<bool>.value;
    boost::test_tools::tt_detail::report_assertion
              ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
               CONCAT44(uVar34,cVar33),(size_t)&local_158,0xae);
    boost::detail::shared_count::~shared_count(&sStack_d8);
    if (uVar16 == 0) {
      local_168 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_160 = "";
      local_178 = &boost::unit_test::basic_cstring<char_const>::null;
      local_170 = &boost::unit_test::basic_cstring<char_const>::null;
      file_00.m_end = (iterator)0xb1;
      file_00.m_begin = (iterator)&local_168;
      msg_00.m_end = in_R9;
      msg_00.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_178,
                 msg_00);
      local_e8[0] = (class_property<bool>)(bVar8 ^ (pCVar19->out).nValue == -1);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_1f0._0_8_ = "result_havecoin == !entry.IsSpent()";
      local_1f0.m_message.px = (element_type *)0xe6ce5d;
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = &local_1f0;
      local_188 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_180 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_188,0xb1);
      boost::detail::shared_count::~shared_count(&sStack_d8);
    }
    if (uVar17 == 0) {
      auStack_b0._8_8_ = local_78;
      auStack_b0._16_8_ = p_Stack_70;
      local_b8 = (undefined1  [8])local_88._0_8_;
      auStack_b0._0_8_ = local_88._8_8_;
      auStack_b0._24_4_ = 0;
      bVar8 = (**(code **)(*(long *)((CCoinsViewCache *)
                                    ((long)local_108.
                                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                                    cachedCoinsUsage + 8))
                        ((long *)((CCoinsViewCache *)
                                 ((long)local_108.
                                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                                 cachedCoinsUsage,local_b8);
      local_198 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_190 = "";
      local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
      local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
      file_01.m_end = (iterator)0xb6;
      file_01.m_begin = (iterator)&local_198;
      msg_01.m_end = in_R9;
      msg_01.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1a8,
                 msg_01);
      local_e8[0] = (class_property<bool>)(bVar8 ^ (pCVar19->out).nValue == -1);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_1f0._0_8_ = "ret == !entry.IsSpent()";
      local_1f0.m_message.px = (element_type *)0xe6ce75;
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = &local_1f0;
      local_1b8 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_1b0 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_1b8,0xb6);
      boost::detail::shared_count::~shared_count(&sStack_d8);
    }
    do {
      pCVar20 = (Coin *)RandomMixin<FastRandomContext>::randbits
                                  (&this_01->super_RandomMixin<FastRandomContext>,3);
      pCVar3 = pCVar19;
      if ((Coin *)0x4 >= pCVar20) {
        pCVar3 = pCVar20;
      }
      pCVar19 = (Coin *)((ulong)pCVar3 & 0xffffffff);
    } while ((Coin *)0x4 < pCVar20);
    if (((int)pCVar3 == 0) || ((a->out).nValue == -1)) {
      CTxOut::CTxOut((CTxOut *)local_b8);
      local_90 = 0;
      do {
        outpoint_00._M_head_impl =
             (CCoinsViewCacheTest *)
             RandomMixin<FastRandomContext>::randbits
                       (&this_01->super_RandomMixin<FastRandomContext>,0x33);
      } while (2100000000000000 < outpoint_00._M_head_impl);
      local_90 = local_90 & 1 | 2;
      local_b8 = (undefined1  [8])outpoint_00._M_head_impl;
      do {
        pCVar21 = (CCoinsViewCache *)
                  RandomMixin<FastRandomContext>::randbits
                            (&this_01->super_RandomMixin<FastRandomContext>,4);
        pCVar15 = &(outpoint_00._M_head_impl)->super_CCoinsViewCache;
        if ((CCoinsViewCache *)0xf >= pCVar21) {
          pCVar15 = pCVar21;
        }
        outpoint_00._M_head_impl = (CCoinsViewCacheTest *)((ulong)pCVar15 & 0xffffffff);
      } while ((CCoinsViewCache *)0xf < pCVar21);
      lVar32 = (a->out).nValue;
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_01->super_RandomMixin<FastRandomContext>,6);
      if (((int)pCVar15 == 0) && (lVar32 == -1)) {
        local_e8[0] = (class_property<bool>)true;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_b0,
                   (size_type)uVar16 + 1,local_e8);
        local_1c8 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_1c0 = "";
        local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
        local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
        file_03.m_end = (iterator)0xc1;
        file_03.m_begin = (iterator)&local_1c8;
        msg_03.m_end = in_R9;
        msg_03.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_1d8
                   ,msg_03);
        uVar14 = local_94 - 0x1d;
        if (local_94 < 0x1d) {
          uVar14 = local_94;
        }
        if (uVar14 == 0) {
LAB_00335508:
          bVar9 = 10000 < uVar14;
        }
        else {
          ppVar31 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_b0;
          if (0x1c < local_94) {
            ppVar31 = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_b0._0_8_;
          }
          bVar9 = true;
          if ((ppVar31->_union).direct[0] != 'j') goto LAB_00335508;
        }
        local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
             (readonly_property<bool>)(readonly_property<bool>)bVar9;
        local_1f0.m_message.px = (element_type *)0x0;
        local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
        local_200._M_next = (_List_node_base *)0xe6ce76;
        local_200._M_prev = (_List_node_base *)0xe6ce9e;
        peStack_e0 = (element_type *)((ulong)peStack_e0 & 0xffffffffffffff00);
        local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
        sStack_d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
        p_Stack_d0 = &local_200;
        local_210 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_208 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  (&local_1f0,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(uVar34,cVar33),
                   (size_t)&local_210,0xc1);
        boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
        rVar11.super_class_property<bool>.value = (class_property<bool>)true;
      }
      else {
        local_e8 = (undefined1  [8])((ulong)(uint7)local_e8._1_7_ << 8);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::assign
                  ((prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_b0,(size_type)uVar16,
                   local_e8);
        outpoint_00._M_head_impl = (CCoinsViewCacheTest *)(a->out).nValue;
        (a->out).nValue = (CAmount)local_b8;
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&(a->out).scriptPubKey.super_CScriptBase,
                   (prevector<28U,_unsigned_char,_unsigned_int,_int> *)auStack_b0);
        uVar36 = uVar36 & 0xff;
        if ((CCoinsViewCache *)outpoint_00._M_head_impl == (CCoinsViewCache *)0xffffffffffffffff) {
          uVar36 = 1;
        }
        uVar34 = uVar34 & 0xff;
        if ((CCoinsViewCache *)outpoint_00._M_head_impl != (CCoinsViewCache *)0xffffffffffffffff) {
          uVar34 = 1;
        }
        *(uint *)&a->field_0x28 = local_90;
      }
      bVar9 = true;
      if ((a->out).nValue == -1) {
        uVar16 = RandomMixin<FastRandomContext>::randbits<32>
                           (&this_01->super_RandomMixin<FastRandomContext>);
        bVar9 = (bool)((byte)uVar16 & 1);
      }
      sStack_d8.pi_ = local_78;
      p_Stack_d0 = p_Stack_70;
      local_e8 = (undefined1  [8])local_88._0_8_;
      peStack_e0 = (element_type *)local_88._8_8_;
      local_c8 = 0;
      CCoinsViewCache::AddCoin
                ((CCoinsViewCache *)
                 ((CCoinsViewCache *)
                 ((long)local_108.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->cachedCoinsUsage,
                 (COutPoint *)local_e8,(Coin *)local_b8,bVar9);
      if (0x1c < local_94) {
        free((void *)auStack_b0._0_8_);
        auStack_b0._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
      }
    }
    else {
      Coin::Clear(a);
      outpoint_00._M_head_impl = (CCoinsViewCacheTest *)local_b8;
      local_220 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_218 = "";
      local_230 = &boost::unit_test::basic_cstring<char_const>::null;
      local_228 = &boost::unit_test::basic_cstring<char_const>::null;
      file_02.m_end = (iterator)0xcf;
      file_02.m_begin = (iterator)&local_220;
      msg_02.m_end = in_R9;
      msg_02.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_230,
                 msg_02);
      auStack_b0._8_8_ = local_78;
      auStack_b0._16_8_ = p_Stack_70;
      local_b8 = (undefined1  [8])local_88._0_8_;
      auStack_b0._0_8_ = local_88._8_8_;
      auStack_b0._24_4_ = 0;
      bVar9 = CCoinsViewCache::SpendCoin
                        ((CCoinsViewCache *)
                         ((CCoinsViewCache *)
                         ((long)local_108.
                                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                         cachedCoinsUsage,(COutPoint *)outpoint_00._M_head_impl,(Coin *)0x0);
      local_1f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
           (readonly_property<bool>)(readonly_property<bool>)bVar9;
      local_1f0.m_message.px = (element_type *)0x0;
      local_1f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
      local_200._M_next = (_List_node_base *)0xe6ce9f;
      local_200._M_prev = (_List_node_base *)0xe6ceca;
      peStack_e0 = (element_type *)((ulong)peStack_e0 & 0xffffffffffffff00);
      local_e8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      sStack_d8.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
      p_Stack_d0 = &local_200;
      local_240 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_238 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                (&local_1f0,(lazy_ostream *)local_e8,1,0,WARN,CONCAT44(uVar34,cVar33),
                 (size_t)&local_240,0xcf);
      boost::detail::shared_count::~shared_count(&local_1f0.m_message.pn);
      rVar10.super_class_property<bool>.value = (class_property<bool>)true;
    }
    do {
      pCVar21 = (CCoinsViewCache *)
                RandomMixin<FastRandomContext>::randbits
                          (&this_01->super_RandomMixin<FastRandomContext>,4);
      pCVar15 = &(outpoint_00._M_head_impl)->super_CCoinsViewCache;
      if ((CCoinsViewCache *)0x9 >= pCVar21) {
        pCVar15 = pCVar21;
      }
      outpoint_00._M_head_impl = (CCoinsViewCacheTest *)((ulong)pCVar15 & 0xffffffff);
    } while ((CCoinsViewCache *)0x9 < pCVar21);
    if ((int)pCVar15 == 0) {
      uVar16 = RandomMixin<FastRandomContext>::randbits<32>
                         (&this_01->super_RandomMixin<FastRandomContext>);
      uVar30 = (uVar16 & 0xffffffff) %
               (ulong)((long)local_128.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)local_128.
                             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 5);
      local_b8 = *(undefined1 (*) [8])
                  local_128.
                  super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar30].m_wrapped.super_base_blob<256U>.
                  m_data._M_elems;
      auStack_b0._0_8_ =
           *(undefined8 *)
            (local_128.
             super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar30].m_wrapped.super_base_blob<256U>.
             m_data._M_elems + 8);
      puVar2 = local_128.
               super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar30].m_wrapped.super_base_blob<256U>.
               m_data._M_elems + 0x10;
      auStack_b0._8_8_ = *(undefined8 *)puVar2;
      auStack_b0._16_8_ = *(undefined8 *)(puVar2 + 8);
      auStack_b0._24_4_ = 0;
      uVar16 = RandomMixin<FastRandomContext>::randbits<32>
                         (&this_01->super_RandomMixin<FastRandomContext>);
      outpoint_00._M_head_impl =
           (CCoinsViewCacheTest *)
           local_108.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
      lVar32 = (long)(int)((uVar16 & 0xffffffff) %
                          (ulong)((long)local_108.
                                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)local_108.
                                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      CCoinsViewCache::Uncache
                (*(CCoinsViewCache **)
                  ((((uint256 *)
                    ((long)local_108.
                           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start + 0x11))->super_base_blob<256U>
                   ).m_data._M_elems + lVar32 * 8 + -0x11),(COutPoint *)local_b8);
      bVar9 = CCoinsViewCache::HaveCoinInCache
                        (*(CCoinsViewCache **)
                          ((((uint256 *)((long)outpoint_00._M_head_impl + 0x11))->
                           super_base_blob<256U>).m_data._M_elems + lVar32 * 8 + -0x11),
                         (COutPoint *)local_b8);
      rVar24.super_class_property<bool>.value =
           (class_property<bool>)((byte)rVar24.super_class_property<bool>.value | !bVar9);
    }
    do {
      pCVar21 = (CCoinsViewCache *)
                RandomMixin<FastRandomContext>::randbits
                          (&this_01->super_RandomMixin<FastRandomContext>,10);
      pCVar15 = &(outpoint_00._M_head_impl)->super_CCoinsViewCache;
      if ((CCoinsViewCache *)0x3e7 >= pCVar21) {
        pCVar15 = pCVar21;
      }
      outpoint_00._M_head_impl = (CCoinsViewCacheTest *)((ulong)pCVar15 & 0xffffffff);
    } while ((CCoinsViewCache *)0x3e7 < pCVar21);
    p_Var22 = local_68._M_impl.super__Rb_tree_header._M_header._M_left;
    if (local_564 == 39999 || (int)pCVar15 == 1) {
      for (; puVar4 = local_108.
                      super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish,
          outpoint_00._M_head_impl =
               (CCoinsViewCacheTest *)
               local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
          (_Rb_tree_header *)p_Var22 != &local_68._M_impl.super__Rb_tree_header;
          p_Var22 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var22)) {
        outpoint = (COutPoint *)(p_Var22 + 1);
        bVar8 = (**(code **)(*(long *)((CCoinsViewCache *)
                                      ((long)local_108.
                                             super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                                      cachedCoinsUsage + 8))
                          ((long *)((CCoinsViewCache *)
                                   ((long)local_108.
                                          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                                   cachedCoinsUsage,outpoint);
        pCVar19 = CCoinsViewCache::AccessCoin
                            ((CCoinsViewCache *)
                             ((CCoinsViewCache *)
                             ((long)local_108.
                                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                             cachedCoinsUsage,outpoint);
        local_250 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_248 = "";
        local_260 = &boost::unit_test::basic_cstring<char_const>::null;
        local_258 = &boost::unit_test::basic_cstring<char_const>::null;
        file_04.m_end = (iterator)0xe0;
        file_04.m_begin = (iterator)&local_250;
        msg_04.m_end = in_R9;
        msg_04.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_04,(size_t)&local_260
                   ,msg_04);
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        local_88._0_8_ = "have == !coin.IsSpent()";
        local_88._8_8_ = "";
        auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
        local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
        auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_b0._16_8_ = local_88;
        local_270 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_268 = "";
        pvVar27 = (iterator)0x1;
        pvVar28 = (iterator)0x0;
        local_e8[0] = (class_property<bool>)
                      (class_property<bool>)(bVar8 ^ (pCVar19->out).nValue == -1);
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                   CONCAT44(uVar34,cVar33),(size_t)&local_270,0xe0);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        local_280 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_278 = "";
        local_290 = &boost::unit_test::basic_cstring<char_const>::null;
        local_288 = &boost::unit_test::basic_cstring<char_const>::null;
        file_05.m_end = (iterator)0xe1;
        file_05.m_begin = (iterator)&local_280;
        msg_05.m_end = pvVar28;
        msg_05.m_begin = pvVar27;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_05,(size_t)&local_290
                   ,msg_05);
        local_e8[0] = (class_property<bool>)
                      anon_unknown.dwarf_6976df::operator==(pCVar19,(Coin *)&p_Var22[2]._M_parent);
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        local_88._0_8_ = "coin == entry.second";
        local_88._8_8_ = "";
        auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
        local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
        auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_b0._16_8_ = local_88;
        local_2a0 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_298 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                   CONCAT44(uVar34,cVar33),(size_t)&local_2a0,0xe1);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        if ((pCVar19->out).nValue == -1) {
          rVar13.super_class_property<bool>.value = (class_property<bool>)true;
        }
        else {
          local_2b0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_2a8 = "";
          local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
          local_2b8 = &boost::unit_test::basic_cstring<char_const>::null;
          file_06.m_end = (iterator)0xe5;
          file_06.m_begin = (iterator)&local_2b0;
          msg_06.m_end = in_R9;
          msg_06.m_begin = in_R8;
          boost::unit_test::unit_test_log_t::set_checkpoint
                    (boost::unit_test::(anonymous_namespace)::unit_test_log,file_06,
                     (size_t)&local_2c0,msg_06);
          bVar9 = CCoinsViewCache::HaveCoinInCache
                            ((CCoinsViewCache *)
                             ((CCoinsViewCache *)
                             ((long)local_108.
                                    super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish + -0x1c8))->
                             cachedCoinsUsage,outpoint);
          local_e8[0] = (class_property<bool>)(class_property<bool>)bVar9;
          peStack_e0 = (element_type *)0x0;
          sStack_d8.pi_ = (sp_counted_base *)0x0;
          local_88._0_8_ = "stack.back()->HaveCoinInCache(entry.first)";
          local_88._8_8_ = "";
          auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
          local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
          auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
          auStack_b0._16_8_ = local_88;
          local_2d0 = 
          "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
          ;
          local_2c8 = "";
          in_R8 = (iterator)0x1;
          in_R9 = (iterator)0x0;
          boost::test_tools::tt_detail::report_assertion
                    ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                     CONCAT44(uVar34,cVar33),(size_t)&local_2d0,0xe5);
          boost::detail::shared_count::~shared_count(&sStack_d8);
          rVar12.super_class_property<bool>.value = (class_property<bool>)true;
        }
      }
      for (; outpoint_00._M_head_impl != (CCoinsViewCacheTest *)puVar4;
          outpoint_00._M_head_impl =
               (CCoinsViewCacheTest *)
               ((((Txid *)&((outpoint_00._M_head_impl)->super_CCoinsViewCache).
                           super_CCoinsViewBacked)->m_wrapped).super_base_blob<256U>.m_data._M_elems
               + 8)) {
        anon_unknown.dwarf_6976df::CCoinsViewCacheTest::SelfTest
                  (*(CCoinsViewCacheTest **)
                    (((Txid *)&((outpoint_00._M_head_impl)->super_CCoinsViewCache).
                               super_CCoinsViewBacked)->m_wrapped).super_base_blob<256U>.m_data.
                    _M_elems,true);
      }
    }
    do {
      pCVar21 = (CCoinsViewCache *)
                RandomMixin<FastRandomContext>::randbits
                          (&this_01->super_RandomMixin<FastRandomContext>,7);
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar15 = &(outpoint_00._M_head_impl)->super_CCoinsViewCache;
      if ((CCoinsViewCache *)0x63 >= pCVar21) {
        pCVar15 = pCVar21;
      }
      outpoint_00._M_head_impl = (CCoinsViewCacheTest *)((ulong)pCVar15 & 0xffffffff);
    } while ((CCoinsViewCache *)0x63 < pCVar21);
    if ((((int)pCVar15 == 0) &&
        (uVar30 = (long)local_108.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_108.
                        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3, 1 < uVar30)) &&
       (uVar16 = RandomMixin<FastRandomContext>::randbits<1>
                           (&this_01->super_RandomMixin<FastRandomContext>), uVar16 == 0)) {
      uVar30 = uVar30 - 2;
      if (uVar30 == 0) {
        uVar14 = 0x40;
      }
      else {
        lVar32 = 0x3f;
        if (uVar30 != 0) {
          for (; uVar30 >> lVar32 == 0; lVar32 = lVar32 + -1) {
          }
        }
        uVar14 = (uint)lVar32 ^ 0x3f;
      }
      pCVar15 = (CCoinsViewCache *)(ulong)(0x40 - uVar14);
      do {
        uVar16 = RandomMixin<FastRandomContext>::randbits
                           (&this_01->super_RandomMixin<FastRandomContext>,0x40 - uVar14);
      } while (uVar30 < uVar16);
      if (fake_best_block) {
        pCVar15 = *(CCoinsViewCache **)
                   ((((uint256 *)((long)puVar4 + 0x11))->super_base_blob<256U>).m_data._M_elems +
                   (uVar16 & 0xffffffff) * 8 + -0x11);
        auStack_b0._8_8_ = (undefined1 *)0x0;
        auStack_b0._16_8_ =
             (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)0x0;
        local_b8 = (undefined1  [8])0x0;
        auStack_b0._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
        output_01.m_size = 0x20;
        output_01.m_data = (byte *)local_b8;
        FastRandomContext::fillrand(this_01,output_01);
        CCoinsViewCache::SetBestBlock(pCVar15,(uint256 *)local_b8);
      }
      do {
        pCVar23 = (CCoinsViewCache *)
                  RandomMixin<FastRandomContext>::randbits
                            (&this_01->super_RandomMixin<FastRandomContext>,2);
        pCVar21 = pCVar15;
        if ((CCoinsViewCache *)0x3 >= pCVar23) {
          pCVar21 = pCVar23;
        }
        pCVar15 = (CCoinsViewCache *)((ulong)pCVar21 & 0xffffffff);
      } while ((CCoinsViewCache *)0x3 < pCVar23);
      local_2e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_2d8 = "";
      local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_2e8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_08.m_end = (iterator)0xf4;
      file_08.m_begin = (iterator)&local_2e0;
      msg_08.m_end = in_R9;
      msg_08.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_08,(size_t)&local_2f0,
                 msg_08);
      pCVar15 = *(CCoinsViewCache **)
                 ((((uint256 *)((long)puVar4 + 0x11))->super_base_blob<256U>).m_data._M_elems +
                 (uVar16 & 0xffffffff) * 8 + -0x11);
      if ((int)pCVar21 < 3) {
        bVar9 = CCoinsViewCache::Flush(pCVar15);
      }
      else {
        bVar9 = CCoinsViewCache::Sync(pCVar15);
      }
      local_e8[0] = (class_property<bool>)(class_property<bool>)bVar9;
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync()";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_300 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_2f8 = "";
      in_R8 = (iterator)0x1;
      in_R9 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_300,0xf4);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      uVar38 = CONCAT71((int7)((ulong)uVar38 >> 8),(byte)uVar38 | 2 < (int)pCVar21);
    }
    do {
      uVar16 = RandomMixin<FastRandomContext>::randbits
                         (&this_01->super_RandomMixin<FastRandomContext>,7);
      puVar5 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    } while (99 < uVar16);
    pCVar15 = (CCoinsViewCache *)(uVar16 & 0xffffffff);
    if ((int)uVar16 == 0) {
      if ((local_108.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish !=
           local_108.
           super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start) &&
         (uVar16 = RandomMixin<FastRandomContext>::randbits<1>
                             (&this_01->super_RandomMixin<FastRandomContext>), uVar16 == 0)) {
        if (fake_best_block) {
          pCVar15 = (CCoinsViewCache *)
                    ((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage;
          auStack_b0._8_8_ = (undefined1 *)0x0;
          auStack_b0._16_8_ =
               (_Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false> *)0x0;
          local_b8 = (undefined1  [8])0x0;
          auStack_b0._0_8_ = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)0x0;
          output_00.m_size = 0x20;
          output_00.m_data = (byte *)local_b8;
          FastRandomContext::fillrand(this_01,output_00);
          CCoinsViewCache::SetBestBlock(pCVar15,(uint256 *)local_b8);
        }
        do {
          pCVar23 = (CCoinsViewCache *)
                    RandomMixin<FastRandomContext>::randbits
                              (&this_01->super_RandomMixin<FastRandomContext>,2);
          pCVar21 = pCVar15;
          if ((CCoinsViewCache *)0x3 >= pCVar23) {
            pCVar21 = pCVar23;
          }
          pCVar15 = (CCoinsViewCache *)((ulong)pCVar21 & 0xffffffff);
        } while ((CCoinsViewCache *)0x3 < pCVar23);
        local_310 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_308 = "";
        local_320 = &boost::unit_test::basic_cstring<char_const>::null;
        local_318 = &boost::unit_test::basic_cstring<char_const>::null;
        file_07.m_end = (iterator)0xfe;
        file_07.m_begin = (iterator)&local_310;
        msg_07.m_end = in_R9;
        msg_07.m_begin = in_R8;
        boost::unit_test::unit_test_log_t::set_checkpoint
                  (boost::unit_test::(anonymous_namespace)::unit_test_log,file_07,(size_t)&local_320
                   ,msg_07);
        if ((int)pCVar21 < 3) {
          bVar9 = CCoinsViewCache::Flush
                            ((CCoinsViewCache *)
                             ((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage);
        }
        else {
          bVar9 = CCoinsViewCache::Sync
                            ((CCoinsViewCache *)
                             ((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage);
        }
        local_e8[0] = (class_property<bool>)(class_property<bool>)bVar9;
        peStack_e0 = (element_type *)0x0;
        sStack_d8.pi_ = (sp_counted_base *)0x0;
        local_88._0_8_ = "should_erase ? stack.back()->Flush() : stack.back()->Sync()";
        local_88._8_8_ = "";
        auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
        local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
        auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
        auStack_b0._16_8_ = local_88;
        local_330 = 
        "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
        ;
        local_328 = "";
        in_R8 = (iterator)0x1;
        in_R9 = (iterator)0x0;
        boost::test_tools::tt_detail::report_assertion
                  ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                   CONCAT44(uVar34,cVar33),(size_t)&local_330,0xfe);
        boost::detail::shared_count::~shared_count(&sStack_d8);
        psVar1 = &((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage;
        local_108.
        super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)psVar1;
        if ((long *)((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage != (long *)0x0) {
          (**(code **)(*(long *)((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage +
                      0x38))();
        }
        uVar38 = CONCAT71((int7)((ulong)uVar38 >> 8),(byte)uVar38 | 2 < (int)pCVar21);
        *psVar1 = 0;
      }
      puVar5 = local_108.
               super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      baseIn = base;
      cVar6.value = true;
      if (local_108.
          super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != puVar4) {
        if ((0x1f < (ulong)((long)local_108.
                                  super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)puVar4)) ||
           (uVar16 = RandomMixin<FastRandomContext>::randbits<1>
                               (&this_01->super_RandomMixin<FastRandomContext>), uVar16 == 0))
        goto LAB_00335f08;
        if (puVar5 != puVar4) {
          baseIn = (CCoinsView *)((CCoinsViewCache *)((long)puVar5 + -0x1c8))->cachedCoinsUsage;
          cVar6 = rVar25.super_class_property<bool>.value;
        }
      }
      rVar25.super_class_property<bool>.value =
           (class_property<bool>)(class_property<bool>)cVar6.value;
      this_00.
      super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
      .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
           (_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
            )operator_new(0x1c8);
      CCoinsViewCache::CCoinsViewCache
                ((CCoinsViewCache *)
                 this_00.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl,baseIn,false);
      *(undefined ***)
       this_00.
       super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
       .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>._M_head_impl =
           &PTR_GetCoin_013ad110;
      local_b8 = (undefined1  [8])
                 this_00.
                 super__Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
                 .super__Head_base<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_false>.
                 _M_head_impl;
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::push_back(&local_108,(value_type *)local_b8);
      if ((_Tuple_impl<0UL,_(anonymous_namespace)::CCoinsViewCacheTest_*,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>
           )local_b8 != (CCoinsViewCacheTest *)0x0) {
        (**(code **)(*(long *)local_b8 + 0x38))();
      }
      cVar33 = cVar33 & 0xff;
      if ((long)local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_108.
                super__Vector_base<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start == 0x20) {
        cVar33 = CHECK_MSG;
      }
    }
LAB_00335f08:
    local_564 = local_564 + 1;
    if (local_564 == 40000) {
      local_340 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_338 = "";
      local_350 = &boost::unit_test::basic_cstring<char_const>::null;
      local_348 = &boost::unit_test::basic_cstring<char_const>::null;
      file_09.m_end = (iterator)0x113;
      file_09.m_begin = (iterator)&local_340;
      msg_09.m_end = in_R9;
      msg_09.m_begin = in_R8;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_09,(size_t)&local_350,
                 msg_09);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "removed_all_caches";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_360 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_358 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      local_e8[0] = rVar25.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_360,0x113,uVar36,uVar38);
      uVar37 = (undefined1)uVar38;
      uVar35 = (undefined1)uVar36;
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_370 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_368 = "";
      local_380 = &boost::unit_test::basic_cstring<char_const>::null;
      local_378 = &boost::unit_test::basic_cstring<char_const>::null;
      file_10.m_end = (iterator)0x114;
      file_10.m_begin = (iterator)&local_370;
      msg_10.m_end = pvVar28;
      msg_10.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_10,(size_t)&local_380,
                 msg_10);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,(char)cVar33) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "reached_4_caches";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_390 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_388 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_390,0x114);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_3a0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_398 = "";
      local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3a8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_11.m_end = (iterator)0x115;
      file_11.m_begin = (iterator)&local_3a0;
      msg_11.m_end = pvVar28;
      msg_11.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_11,(size_t)&local_3b0,
                 msg_11);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,uVar35) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "added_an_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_3c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3b8 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_3c0,0x115);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_3d0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3c8 = "";
      local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_3d8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_12.m_end = (iterator)0x116;
      file_12.m_begin = (iterator)&local_3d0;
      msg_12.m_end = pvVar28;
      msg_12.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_12,(size_t)&local_3e0,
                 msg_12);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "added_an_unspendable_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_3f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3e8 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      local_e8[0] = rVar11.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_3f0,0x116);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_400 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_3f8 = "";
      local_410 = &boost::unit_test::basic_cstring<char_const>::null;
      local_408 = &boost::unit_test::basic_cstring<char_const>::null;
      file_13.m_end = (iterator)0x117;
      file_13.m_begin = (iterator)&local_400;
      msg_13.m_end = pvVar28;
      msg_13.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_13,(size_t)&local_410,
                 msg_13);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "removed_an_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_420 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_418 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      local_e8[0] = rVar10.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_420,0x117);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_430 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_428 = "";
      local_440 = &boost::unit_test::basic_cstring<char_const>::null;
      local_438 = &boost::unit_test::basic_cstring<char_const>::null;
      file_14.m_end = (iterator)0x118;
      file_14.m_begin = (iterator)&local_430;
      msg_14.m_end = pvVar28;
      msg_14.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_14,(size_t)&local_440,
                 msg_14);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,(char)uVar34) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "updated_an_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_450 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_448 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_450,0x118);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_460 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_458 = "";
      local_470 = &boost::unit_test::basic_cstring<char_const>::null;
      local_468 = &boost::unit_test::basic_cstring<char_const>::null;
      file_15.m_end = (iterator)0x119;
      file_15.m_begin = (iterator)&local_460;
      msg_15.m_end = pvVar28;
      msg_15.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_15,(size_t)&local_470,
                 msg_15);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "found_an_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_480 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_478 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      local_e8[0] = rVar12.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_480,0x119);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_490 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_488 = "";
      local_4a0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_498 = &boost::unit_test::basic_cstring<char_const>::null;
      file_16.m_end = (iterator)0x11a;
      file_16.m_begin = (iterator)&local_490;
      msg_16.m_end = pvVar28;
      msg_16.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_16,(size_t)&local_4a0,
                 msg_16);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "missed_an_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_4b0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4a8 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      local_e8[0] = rVar13.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_4b0,0x11a);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_4c0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4b8 = "";
      local_4d0 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4c8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_17.m_end = (iterator)0x11b;
      file_17.m_begin = (iterator)&local_4c0;
      msg_17.m_end = pvVar28;
      msg_17.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_17,(size_t)&local_4d0,
                 msg_17);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "uncached_an_entry";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_4e0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4d8 = "";
      pvVar27 = (iterator)0x1;
      pvVar28 = (iterator)0x0;
      local_e8[0] = rVar24.super_class_property<bool>.value;
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_4e0,0x11b);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      local_4f0 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_4e8 = "";
      local_500 = &boost::unit_test::basic_cstring<char_const>::null;
      local_4f8 = &boost::unit_test::basic_cstring<char_const>::null;
      file_18.m_end = (iterator)0x11c;
      file_18.m_begin = (iterator)&local_4f0;
      msg_18.m_end = pvVar28;
      msg_18.m_begin = pvVar27;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,file_18,(size_t)&local_500,
                 msg_18);
      local_e8 = (undefined1  [8])(CONCAT71(local_e8._1_7_,uVar37) & 0xffffffffffffff01);
      peStack_e0 = (element_type *)0x0;
      sStack_d8.pi_ = (sp_counted_base *)0x0;
      local_88._0_8_ = "flushed_without_erase";
      local_88._8_8_ = "";
      auStack_b0._0_8_ = auStack_b0._0_8_ & 0xffffffffffffff00;
      local_b8 = (undefined1  [8])&PTR__lazy_ostream_013abc70;
      auStack_b0._8_8_ = boost::unit_test::lazy_ostream::inst;
      auStack_b0._16_8_ = local_88;
      local_510 = 
      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/coins_tests.cpp"
      ;
      local_508 = "";
      boost::test_tools::tt_detail::report_assertion
                ((assertion_result *)local_e8,(lazy_ostream *)local_b8,1,0,WARN,
                 CONCAT44(uVar34,cVar33),(size_t)&local_510,0x11c);
      boost::detail::shared_count::~shared_count(&sStack_d8);
      if (local_128.
          super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_128.
                        super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_128.
                              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_128.
                              super__Vector_base<transaction_identifier<false>,_std::allocator<transaction_identifier<false>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      std::
      vector<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>,_std::allocator<std::unique_ptr<(anonymous_namespace)::CCoinsViewCacheTest,_std::default_delete<(anonymous_namespace)::CCoinsViewCacheTest>_>_>_>
      ::~vector(&local_108);
      std::
      _Rb_tree<COutPoint,_std::pair<const_COutPoint,_Coin>,_std::_Select1st<std::pair<const_COutPoint,_Coin>_>,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
      ::~_Rb_tree(&local_68);
      if (*(ListNode **)(in_FS_OFFSET + 0x28) == local_38) {
        return;
      }
      __stack_chk_fail();
    }
  } while( true );
}

Assistant:

void SimulationTest(CCoinsView* base, bool fake_best_block)
{
    // Various coverage trackers.
    bool removed_all_caches = false;
    bool reached_4_caches = false;
    bool added_an_entry = false;
    bool added_an_unspendable_entry = false;
    bool removed_an_entry = false;
    bool updated_an_entry = false;
    bool found_an_entry = false;
    bool missed_an_entry = false;
    bool uncached_an_entry = false;
    bool flushed_without_erase = false;

    // A simple map to track what we expect the cache stack to represent.
    std::map<COutPoint, Coin> result;

    // The cache stack.
    std::vector<std::unique_ptr<CCoinsViewCacheTest>> stack; // A stack of CCoinsViewCaches on top.
    stack.push_back(std::make_unique<CCoinsViewCacheTest>(base)); // Start with one cache.

    // Use a limited set of random transaction ids, so we do test overwriting entries.
    std::vector<Txid> txids;
    txids.resize(NUM_SIMULATION_ITERATIONS / 8);
    for (unsigned int i = 0; i < txids.size(); i++) {
        txids[i] = Txid::FromUint256(m_rng.rand256());
    }

    for (unsigned int i = 0; i < NUM_SIMULATION_ITERATIONS; i++) {
        // Do a random modification.
        {
            auto txid = txids[m_rng.randrange(txids.size())]; // txid we're going to modify in this iteration.
            Coin& coin = result[COutPoint(txid, 0)];

            // Determine whether to test HaveCoin before or after Access* (or both). As these functions
            // can influence each other's behaviour by pulling things into the cache, all combinations
            // are tested.
            bool test_havecoin_before = m_rng.randbits(2) == 0;
            bool test_havecoin_after = m_rng.randbits(2) == 0;

            bool result_havecoin = test_havecoin_before ? stack.back()->HaveCoin(COutPoint(txid, 0)) : false;

            // Infrequently, test usage of AccessByTxid instead of AccessCoin - the
            // former just delegates to the latter and returns the first unspent in a txn.
            const Coin& entry = (m_rng.randrange(500) == 0) ?
                AccessByTxid(*stack.back(), txid) : stack.back()->AccessCoin(COutPoint(txid, 0));
            BOOST_CHECK(coin == entry);

            if (test_havecoin_before) {
                BOOST_CHECK(result_havecoin == !entry.IsSpent());
            }

            if (test_havecoin_after) {
                bool ret = stack.back()->HaveCoin(COutPoint(txid, 0));
                BOOST_CHECK(ret == !entry.IsSpent());
            }

            if (m_rng.randrange(5) == 0 || coin.IsSpent()) {
                Coin newcoin;
                newcoin.out.nValue = RandMoney(m_rng);
                newcoin.nHeight = 1;

                // Infrequently test adding unspendable coins.
                if (m_rng.randrange(16) == 0 && coin.IsSpent()) {
                    newcoin.out.scriptPubKey.assign(1 + m_rng.randbits(6), OP_RETURN);
                    BOOST_CHECK(newcoin.out.scriptPubKey.IsUnspendable());
                    added_an_unspendable_entry = true;
                } else {
                    // Random sizes so we can test memory usage accounting
                    newcoin.out.scriptPubKey.assign(m_rng.randbits(6), 0);
                    (coin.IsSpent() ? added_an_entry : updated_an_entry) = true;
                    coin = newcoin;
                }
                bool is_overwrite = !coin.IsSpent() || m_rng.rand32() & 1;
                stack.back()->AddCoin(COutPoint(txid, 0), std::move(newcoin), is_overwrite);
            } else {
                // Spend the coin.
                removed_an_entry = true;
                coin.Clear();
                BOOST_CHECK(stack.back()->SpendCoin(COutPoint(txid, 0)));
            }
        }

        // Once every 10 iterations, remove a random entry from the cache
        if (m_rng.randrange(10) == 0) {
            COutPoint out(txids[m_rng.rand32() % txids.size()], 0);
            int cacheid = m_rng.rand32() % stack.size();
            stack[cacheid]->Uncache(out);
            uncached_an_entry |= !stack[cacheid]->HaveCoinInCache(out);
        }

        // Once every 1000 iterations and at the end, verify the full cache.
        if (m_rng.randrange(1000) == 1 || i == NUM_SIMULATION_ITERATIONS - 1) {
            for (const auto& entry : result) {
                bool have = stack.back()->HaveCoin(entry.first);
                const Coin& coin = stack.back()->AccessCoin(entry.first);
                BOOST_CHECK(have == !coin.IsSpent());
                BOOST_CHECK(coin == entry.second);
                if (coin.IsSpent()) {
                    missed_an_entry = true;
                } else {
                    BOOST_CHECK(stack.back()->HaveCoinInCache(entry.first));
                    found_an_entry = true;
                }
            }
            for (const auto& test : stack) {
                test->SelfTest();
            }
        }

        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, flush an intermediate cache
            if (stack.size() > 1 && m_rng.randbool() == 0) {
                unsigned int flushIndex = m_rng.randrange(stack.size() - 1);
                if (fake_best_block) stack[flushIndex]->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack[flushIndex]->Flush() : stack[flushIndex]->Sync());
                flushed_without_erase |= !should_erase;
            }
        }
        if (m_rng.randrange(100) == 0) {
            // Every 100 iterations, change the cache stack.
            if (stack.size() > 0 && m_rng.randbool() == 0) {
                //Remove the top cache
                if (fake_best_block) stack.back()->SetBestBlock(m_rng.rand256());
                bool should_erase = m_rng.randrange(4) < 3;
                BOOST_CHECK(should_erase ? stack.back()->Flush() : stack.back()->Sync());
                flushed_without_erase |= !should_erase;
                stack.pop_back();
            }
            if (stack.size() == 0 || (stack.size() < 4 && m_rng.randbool())) {
                //Add a new cache
                CCoinsView* tip = base;
                if (stack.size() > 0) {
                    tip = stack.back().get();
                } else {
                    removed_all_caches = true;
                }
                stack.push_back(std::make_unique<CCoinsViewCacheTest>(tip));
                if (stack.size() == 4) {
                    reached_4_caches = true;
                }
            }
        }
    }

    // Verify coverage.
    BOOST_CHECK(removed_all_caches);
    BOOST_CHECK(reached_4_caches);
    BOOST_CHECK(added_an_entry);
    BOOST_CHECK(added_an_unspendable_entry);
    BOOST_CHECK(removed_an_entry);
    BOOST_CHECK(updated_an_entry);
    BOOST_CHECK(found_an_entry);
    BOOST_CHECK(missed_an_entry);
    BOOST_CHECK(uncached_an_entry);
    BOOST_CHECK(flushed_without_erase);
}